

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_10.cpp
# Opt level: O0

char promptCalculationType(void)

{
  ostream *poVar1;
  char local_9 [8];
  char answer;
  
  std::operator<<((ostream *)&std::cout,
                  "Would you like to calculate permutations (P) or combinations (C)? ");
  local_9[0] = ' ';
  while( true ) {
    std::operator>>((istream *)&std::cin,local_9);
    if ((local_9[0] == 'P') || (local_9[0] == 'C')) break;
    poVar1 = std::operator<<((ostream *)&std::cerr,local_9[0]);
    std::operator<<(poVar1," is not a valid choice. The valid choices are: P or C\n");
    std::ios::rdbuf();
  }
  return local_9[0];
}

Assistant:

char promptCalculationType()
{
	std::cout << "Would you like to calculate permutations (P) or combinations (C)? ";
	char answer = ' ';
	while (true)
	{
		std::cin >> answer;
		if (answer == 'P' || answer == 'C')
			break;
		else
			std::cerr << answer << " is not a valid choice. The valid choices are: P or C\n";
		std::cin.rdbuf();
	}
	return answer;
}